

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  string local_28;
  
  if (this->collectComments_ == false) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_reader.cpp"
                  ,0x164,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  if (placement == commentAfterOnSameLine) {
    this_00 = this->lastValue_;
    if (this_00 == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_reader.cpp"
                    ,0x166,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_28);
    Value::setComment(this_00,&local_28,commentAfterOnSameLine);
  }
  else {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_28);
    std::__cxx11::string::append((string *)&this->commentsBefore_);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(std::string(begin, end), placement);
  } else {
    commentsBefore_ += std::string(begin, end);
  }
}